

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawColumnRt4PalCommand::Execute(DrawColumnRt4PalCommand *this,DrawerThread *thread)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int pitch;
  int count;
  uint8_t *dest;
  uint8_t *source;
  uint8_t *colormap;
  DrawerThread *thread_local;
  DrawColumnRt4PalCommand *this_local;
  
  uVar3 = DrawerThread::count_for_thread
                    (thread,(this->super_PalRtCommand).yl,
                     ((this->super_PalRtCommand).yh - (this->super_PalRtCommand).yl) + 1);
  if (0 < (int)uVar3) {
    puVar1 = (this->super_PalRtCommand)._colormap;
    iVar5 = (this->super_PalRtCommand).yl;
    iVar4 = DrawerThread::skipped_by_thread(thread,(this->super_PalRtCommand).yl);
    _pitch = (this->super_PalRtCommand)._destorg +
             (*(int *)(ylookup + (long)(iVar5 + iVar4) * 4) + (this->super_PalRtCommand).sx);
    puVar2 = thread->dc_temp;
    iVar5 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    dest = puVar2 + (iVar5 << 2);
    iVar5 = (this->super_PalRtCommand)._pitch * thread->num_cores;
    if ((uVar3 & 1) != 0) {
      *_pitch = puVar1[*dest];
      _pitch[1] = puVar1[dest[1]];
      _pitch[2] = puVar1[dest[2]];
      _pitch[3] = puVar1[dest[3]];
      dest = dest + 4;
      _pitch = _pitch + iVar5;
    }
    for (iVar4 = (int)uVar3 >> 1; iVar4 != 0; iVar4 = iVar4 + -1) {
      *_pitch = puVar1[*dest];
      _pitch[1] = puVar1[dest[1]];
      _pitch[2] = puVar1[dest[2]];
      _pitch[3] = puVar1[dest[3]];
      _pitch[iVar5] = puVar1[dest[4]];
      _pitch[iVar5 + 1] = puVar1[dest[5]];
      _pitch[iVar5 + 2] = puVar1[dest[6]];
      _pitch[iVar5 + 3] = puVar1[dest[7]];
      dest = dest + 8;
      _pitch = _pitch + iVar5 * 2;
    }
  }
  return;
}

Assistant:

void DrawColumnRt4PalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int count;
		int pitch;

		count = yh - yl + 1;

		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		colormap = _colormap;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		pitch = _pitch*thread->num_cores;
	
		if (count & 1) {
			dest[0] = colormap[source[0]];
			dest[1] = colormap[source[1]];
			dest[2] = colormap[source[2]];
			dest[3] = colormap[source[3]];
			source += 4;
			dest += pitch;
		}
		if (!(count >>= 1))
			return;

		do {
			dest[0] = colormap[source[0]];
			dest[1] = colormap[source[1]];
			dest[2] = colormap[source[2]];
			dest[3] = colormap[source[3]];
			dest[pitch] = colormap[source[4]];
			dest[pitch+1] = colormap[source[5]];
			dest[pitch+2] = colormap[source[6]];
			dest[pitch+3] = colormap[source[7]];
			source += 8;
			dest += pitch*2;
		} while (--count);
	}